

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O3

int pkey_hkdf_derive(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *out_len)

{
  int *piVar1;
  EVP_MD *md;
  size_t prk_len;
  size_t sVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  uint8_t *info;
  size_t info_len;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8_t *puVar6;
  size_t sVar7;
  int line;
  
  piVar1 = (int *)ctx->data;
  md = *(EVP_MD **)(piVar1 + 2);
  if (md == (EVP_MD *)0x0) {
    iVar5 = 0x76;
    line = 0x68;
  }
  else {
    prk_len = *(size_t *)(piVar1 + 6);
    if (prk_len == 0) {
      iVar5 = 0x78;
      line = 0x6c;
    }
    else {
      iVar5 = *piVar1;
      if (out == (uint8_t *)0x0) {
        if (iVar5 != 1) {
          return 1;
        }
        iVar5 = EVP_MD_size(md);
        *out_len = CONCAT44(extraout_var,iVar5);
        return 1;
      }
      if (iVar5 == 2) {
        sVar2 = *out_len;
        puVar3 = *(uint8_t **)(piVar1 + 4);
        puVar6 = CBB_data((CBB *)(piVar1 + 0xc));
        sVar7 = CBB_len((CBB *)(piVar1 + 0xc));
        iVar5 = HKDF_expand(out,sVar2,(EVP_MD *)md,puVar3,prk_len,puVar6,sVar7);
        return iVar5;
      }
      if (iVar5 == 1) {
        uVar4 = *out_len;
        iVar5 = EVP_MD_size(md);
        if (CONCAT44(extraout_var_00,iVar5) <= uVar4) {
          iVar5 = HKDF_extract(out,out_len,*(EVP_MD **)(piVar1 + 2),*(uint8_t **)(piVar1 + 4),
                               *(size_t *)(piVar1 + 6),*(uint8_t **)(piVar1 + 8),
                               *(size_t *)(piVar1 + 10));
          return iVar5;
        }
        iVar5 = 100;
        line = 0x80;
      }
      else {
        if (iVar5 == 0) {
          sVar2 = *out_len;
          puVar3 = *(uint8_t **)(piVar1 + 4);
          puVar6 = *(uint8_t **)(piVar1 + 8);
          sVar7 = *(size_t *)(piVar1 + 10);
          info = CBB_data((CBB *)(piVar1 + 0xc));
          info_len = CBB_len((CBB *)(piVar1 + 0xc));
          iVar5 = HKDF(out,sVar2,(EVP_MD *)md,puVar3,prk_len,puVar6,sVar7,info,info_len);
          return iVar5;
        }
        iVar5 = 0x44;
        line = 0x8a;
      }
    }
  }
  ERR_put_error(6,0,iVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_hkdf.cc"
                ,line);
  return 0;
}

Assistant:

static int pkey_hkdf_derive(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *out_len) {
  HKDF_PKEY_CTX *hctx = reinterpret_cast<HKDF_PKEY_CTX *>(ctx->data);
  if (hctx->md == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }
  if (hctx->key_len == 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }

  if (out == NULL) {
    if (hctx->mode == EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY) {
      *out_len = EVP_MD_size(hctx->md);
    }
    // HKDF-Expand is variable-length and returns |*out_len| bytes. "Output" the
    // input length by leaving it alone.
    return 1;
  }

  switch (hctx->mode) {
    case EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND:
      return HKDF(out, *out_len, hctx->md, hctx->key, hctx->key_len, hctx->salt,
                  hctx->salt_len, CBB_data(&hctx->info), CBB_len(&hctx->info));

    case EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY:
      if (*out_len < EVP_MD_size(hctx->md)) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
        return 0;
      }
      return HKDF_extract(out, out_len, hctx->md, hctx->key, hctx->key_len,
                          hctx->salt, hctx->salt_len);

    case EVP_PKEY_HKDEF_MODE_EXPAND_ONLY:
      return HKDF_expand(out, *out_len, hctx->md, hctx->key, hctx->key_len,
                         CBB_data(&hctx->info), CBB_len(&hctx->info));
  }
  OPENSSL_PUT_ERROR(EVP, ERR_R_INTERNAL_ERROR);
  return 0;
}